

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_> * __thiscall
wallet::DescriptorScriptPubKeyMan::MarkUnusedAddresses
          (vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>
           *__return_storage_ptr__,DescriptorScriptPubKeyMan *this,CScript *script)

{
  int32_t *piVar1;
  uint uVar2;
  long lVar3;
  element_type *peVar4;
  int iVar5;
  int iVar6;
  mapped_type_conflict3 *pmVar7;
  runtime_error *this_00;
  long in_FS_OFFSET;
  allocator<char> local_119;
  vector<CScript,_std::allocator<CScript>_> scripts_temp;
  __single_object out_keys;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock60;
  WalletDestination local_e0;
  CTxDestination dest;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock60,&this->cs_desc_man,"cs_desc_man",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x8e7,false);
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[3])(this,script);
  if (iVar5 != 0) {
    pmVar7 = std::
             map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
             ::operator[](&this->m_map_script_pub_keys,script);
    iVar5 = *pmVar7;
    if ((this->m_wallet_descriptor).next_index <= iVar5) {
      ScriptPubKeyMan::WalletLogPrintf<char_const*,int>
                (&this->super_ScriptPubKeyMan,
                 "%s: Detected a used keypool item at index %d, mark all keypool items up to this item as used\n"
                 ,"MarkUnusedAddresses",iVar5);
      std::make_unique<FlatSigningProvider>();
      scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      while (uVar2 = (this->m_wallet_descriptor).next_index, (int)uVar2 <= iVar5) {
        peVar4 = (this->m_wallet_descriptor).descriptor.
                 super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar6 = (*peVar4->_vptr_Descriptor[9])
                          (peVar4,(ulong)uVar2,&(this->m_wallet_descriptor).cache,&scripts_temp,
                           out_keys._M_t.
                           super___uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>
                           .super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl);
        if ((char)iVar6 == '\0') {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&dest,"MarkUnusedAddresses",&local_119);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dest,
                         ": Unable to expand descriptor from cache");
          std::runtime_error::runtime_error(this_00,(string *)&local_e0);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_009753de;
        }
        dest.
        super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ._M_u._16_8_ = 0;
        dest.
        super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ._M_u._24_8_ = 0;
        dest.
        super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ._M_u._0_8_ = 0;
        dest.
        super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ._M_u._8_8_ = 0;
        dest.
        super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ._M_index = '\0';
        ExtractDestination(scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>.
                           _M_impl.super__Vector_impl_data._M_start,&dest);
        std::__detail::__variant::
        _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&local_e0,
                          (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&dest);
        local_e0.internal.super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool>._M_engaged = false;
        std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>::
        emplace_back<wallet::WalletDestination>(__return_storage_ptr__,&local_e0);
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_e0);
        piVar1 = &(this->m_wallet_descriptor).next_index;
        *piVar1 = *piVar1 + 1;
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&dest);
      }
      std::vector<CScript,_std::allocator<CScript>_>::~vector(&scripts_temp);
      std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::~unique_ptr
                (&out_keys);
    }
    iVar5 = (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[9])(this,0);
    if ((char)iVar5 == '\0') {
      ScriptPubKeyMan::WalletLogPrintf<char_const*>
                (&this->super_ScriptPubKeyMan,"%s: Topping up keypool failed (locked wallet)\n",
                 "MarkUnusedAddresses");
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock60.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return __return_storage_ptr__;
  }
LAB_009753de:
  __stack_chk_fail();
}

Assistant:

std::vector<WalletDestination> DescriptorScriptPubKeyMan::MarkUnusedAddresses(const CScript& script)
{
    LOCK(cs_desc_man);
    std::vector<WalletDestination> result;
    if (IsMine(script)) {
        int32_t index = m_map_script_pub_keys[script];
        if (index >= m_wallet_descriptor.next_index) {
            WalletLogPrintf("%s: Detected a used keypool item at index %d, mark all keypool items up to this item as used\n", __func__, index);
            auto out_keys = std::make_unique<FlatSigningProvider>();
            std::vector<CScript> scripts_temp;
            while (index >= m_wallet_descriptor.next_index) {
                if (!m_wallet_descriptor.descriptor->ExpandFromCache(m_wallet_descriptor.next_index, m_wallet_descriptor.cache, scripts_temp, *out_keys)) {
                    throw std::runtime_error(std::string(__func__) + ": Unable to expand descriptor from cache");
                }
                CTxDestination dest;
                ExtractDestination(scripts_temp[0], dest);
                result.push_back({dest, std::nullopt});
                m_wallet_descriptor.next_index++;
            }
        }
        if (!TopUp()) {
            WalletLogPrintf("%s: Topping up keypool failed (locked wallet)\n", __func__);
        }
    }

    return result;
}